

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O3

vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> *
rcg::System::getSystems(void)

{
  undefined1 *__n;
  pointer __s2;
  _Alloc_hider _Var1;
  pointer pbVar2;
  int iVar3;
  char *pcVar4;
  System *this;
  GenTLException *this_00;
  char *extraout_RDX;
  char *extraout_RDX_00;
  long lVar5;
  vector<std::shared_ptr<rcg::System>,std::allocator<std::shared_ptr<rcg::System>>> *in_RDI;
  long lVar6;
  ulong uVar7;
  uint uVar8;
  long *plVar9;
  bool bVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name;
  ostringstream info;
  string local_1e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  ulong local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)(anonymous_namespace)::system_mtx);
  if (iVar3 == 0) {
    *(undefined8 *)in_RDI = 0;
    *(undefined8 *)(in_RDI + 8) = 0;
    *(undefined8 *)(in_RDI + 0x10) = 0;
    pcVar4 = extraout_RDX;
    if (DAT_0012b600 == 0) {
      pcVar4 = getenv("GENICAM_GENTL64_PATH");
      setSystemsPath(pcVar4,(char *)0x0);
      pcVar4 = extraout_RDX_00;
    }
    getAvailableGenTLs_abi_cxx11_(&local_1c8,(anonymous_namespace)::system_path_abi_cxx11_,pcVar4);
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    if (local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar7 = 0;
      do {
        pbVar2 = local_1c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        __n = (undefined1 *)
              local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_string_length;
        local_1b0 = uVar7;
        if (DAT_0012b5e8 - (long)(anonymous_namespace)::system_list != 0) {
          __s2 = local_1c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p;
          lVar5 = DAT_0012b5e8 - (long)(anonymous_namespace)::system_list >> 4;
          lVar6 = 0;
          plVar9 = (anonymous_namespace)::system_list;
          do {
            if ((*(undefined1 **)(*plVar9 + 0x18) == __n) &&
               ((__n == (undefined1 *)0x0 ||
                (iVar3 = bcmp(*(void **)(*plVar9 + 0x10),__s2,(size_t)__n), iVar3 == 0)))) {
              uVar8 = (uint)lVar6;
              goto LAB_00108d74;
            }
            lVar6 = lVar6 + 1;
            plVar9 = plVar9 + 2;
          } while (lVar5 + (ulong)(lVar5 == 0) != lVar6);
        }
        uVar8 = 0xffffffff;
LAB_00108d74:
        if ((undefined1 *)((long)&DAT_0012b620[-1]._M_weak_count + 3U) < __n) {
          std::__cxx11::string::substr((ulong)&local_1e8,(ulong)(pbVar2 + uVar7));
          _Var1._M_p = local_1e8._M_dataplus._M_p;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length ==
              DAT_0012b620) {
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              bVar10 = true;
            }
            else {
              iVar3 = bcmp(local_1e8._M_dataplus._M_p,
                           (anonymous_namespace)::system_ignore_abi_cxx11_,
                           local_1e8._M_string_length);
              bVar10 = iVar3 == 0;
            }
          }
          else {
            bVar10 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var1._M_p != &local_1e8.field_2) {
            operator_delete(_Var1._M_p);
          }
          if (!bVar10) goto LAB_00108df0;
        }
        else {
LAB_00108df0:
          if ((int)uVar8 < 0) {
            this = (System *)operator_new(0xb0);
            System(this,local_1c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar7);
            std::__shared_ptr<rcg::System,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<rcg::System,void>
                      ((__shared_ptr<rcg::System,(__gnu_cxx::_Lock_policy)2> *)&local_1e8,this);
            std::vector<std::shared_ptr<rcg::System>,std::allocator<std::shared_ptr<rcg::System>>>::
            emplace_back<std::shared_ptr<rcg::System>>(in_RDI,(shared_ptr<rcg::System> *)&local_1e8)
            ;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._M_string_length)
              ;
            }
          }
          else {
            std::
            vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
            push_back((vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
                       *)in_RDI,
                      (value_type *)((anonymous_namespace)::system_list + (ulong)uVar8 * 2));
          }
        }
        uVar7 = local_1b0 + 1;
      } while (uVar7 < (ulong)((long)local_1c8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_1c8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    std::vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>::
    operator=((vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
               *)&(anonymous_namespace)::system_list,
              (vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_>
               *)in_RDI);
    if (*(long *)(in_RDI + 8) != *(long *)in_RDI) {
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1c8);
      pthread_mutex_unlock((pthread_mutex_t *)(anonymous_namespace)::system_mtx);
      return (vector<std::shared_ptr<rcg::System>,_std::allocator<std::shared_ptr<rcg::System>_>_> *
             )in_RDI;
    }
  }
  else {
    std::__throw_system_error(iVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"No transport layers found in path: ",0x23);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(char *)(anonymous_namespace)::system_path_abi_cxx11_,DAT_0012b600
            );
  this_00 = (GenTLException *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  GenTLException::GenTLException(this_00,&local_1e8);
  __cxa_throw(this_00,&GenTLException::typeinfo,GenTLException::~GenTLException);
}

Assistant:

std::vector<std::shared_ptr<System> > System::getSystems()
{
  std::lock_guard<std::recursive_mutex> lock(system_mtx);
  std::vector<std::shared_ptr<System> > ret;

  // ensure that system_path is defined

  if (system_path.size() == 0)
  {
    const char *env=0;
    if (sizeof(size_t) == 8)
    {
      env="GENICAM_GENTL64_PATH";
    }
    else
    {
      env="GENICAM_GENTL32_PATH";
    }

    setSystemsPath(std::getenv(env), 0);
  }

  // get list of all available transport layer libraries

  std::vector<std::string> name=getAvailableGenTLs(system_path.c_str());
  std::ostringstream info;

  // create list of systems according to the list, using either existing
  // systems or instantiating new ones

  for (size_t i=0; i<name.size(); i++)
  {
    int k=find(system_list, name[i]);

    if (system_ignore.size() > 0)
    {
      // skipping if name equals ignore

      if (name[i].size() >= system_ignore.size() &&
          name[i].substr(name[i].size()-system_ignore.size()) == system_ignore)
      {
        continue;
      }
    }

    if (k >= 0)
    {
      ret.push_back(system_list[static_cast<size_t>(k)]);
    }
    else
    {
      try
      {
        System *p=new System(name[i]);
        ret.push_back(std::shared_ptr<System>(p));
      }
      catch (const std::exception &ex)
      {
        // ignore transport layers that cannot be used, but collect reason
        // for failure

        info << ex.what() << std::endl;
      }
    }
  }

  // remember returned list for reusing existing systems on the next call

  system_list=ret;

  // throw exception if no transport layers are available

  if (ret.size() == 0)
  {
    info << "No transport layers found in path: " << system_path;
    throw GenTLException(info.str());
  }

  return ret;
}